

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ADE_DEP_DPFSP.cpp
# Opt level: O1

void __thiscall
ADE_DEP_DPFSP::subCrossover(ADE_DEP_DPFSP *this,Permutazione *i1,Permutazione *i2,Permutazione *ris)

{
  unsigned_short *puVar1;
  undefined2 uVar2;
  ushort uVar3;
  void *__s;
  ulong uVar5;
  uint uVar6;
  ushort uVar7;
  undefined2 *puVar8;
  Permutazione *pPVar9;
  ulong uVar10;
  uint uVar11;
  ushort uVar12;
  ulong uVar13;
  uniform_int_distribution<int> local_60;
  undefined2 *local_58;
  Permutazione *local_50;
  Permutazione *local_48;
  ADE_DEP_DPFSP *local_40;
  Permutazione *local_38;
  result_type rVar4;
  
  uVar5 = (ulong)i1->dimensione;
  local_50 = ris;
  local_48 = i1;
  __s = operator_new__(uVar5);
  local_40 = this;
  local_58 = (undefined2 *)operator_new__((ulong)(this->istanza).fabbriche << 2);
  if (uVar5 != 0) {
    memset(__s,0,uVar5);
  }
  uVar3 = local_48->dimensione;
  uVar6 = 0;
  uVar12 = 0;
  uVar7 = 0;
  puVar8 = local_58;
  pPVar9 = local_48;
  local_38 = i2;
  do {
    if ((uVar12 == uVar3) || ((local_40->istanza).lavori <= pPVar9->individuo[uVar12])) {
      local_60._M_param._M_b = uVar6;
      if (uVar7 == 0) {
        local_60._M_param._M_a = 0;
        rVar4 = std::uniform_int_distribution<int>::operator()
                          (&local_60,&genRand.gen,&local_60._M_param);
        uVar2 = (undefined2)rVar4;
        puVar8 = local_58;
      }
      else {
        local_60._M_param._M_a = (ushort)puVar8[(ulong)uVar7 - 1] + 1;
        rVar4 = std::uniform_int_distribution<int>::operator()
                          (&local_60,&genRand.gen,&local_60._M_param);
        uVar2 = (undefined2)rVar4;
        puVar8 = puVar8 + uVar7;
      }
      *puVar8 = uVar2;
      local_58[(ulong)uVar7 + 1] = uVar12;
      uVar5 = (ulong)(ushort)local_58[uVar7];
      if ((ushort)local_58[uVar7] < uVar12) {
        puVar1 = local_48->individuo;
        do {
          *(undefined1 *)((long)__s + (ulong)puVar1[uVar5]) = 1;
          uVar5 = uVar5 + 1;
        } while (uVar5 < uVar12);
      }
      uVar7 = uVar7 + 2;
      i2 = local_38;
      puVar8 = local_58;
      pPVar9 = local_48;
    }
    uVar12 = uVar12 + 1;
    uVar6 = (uint)uVar12;
    uVar3 = pPVar9->dimensione;
  } while (uVar12 <= uVar3);
  uVar3 = i2->dimensione;
  uVar5 = 0;
  uVar10 = 0;
  uVar7 = 0;
  do {
    uVar13 = uVar5 & 0xffff;
    uVar6 = (uint)uVar10;
    if (((ushort)uVar5 == uVar3) ||
       (uVar3 = i2->individuo[uVar13], (local_40->istanza).lavori <= uVar3)) {
      uVar3 = puVar8[uVar7];
      if (puVar8[(ulong)uVar7 + 1] != uVar3) {
        uVar11 = (uint)(ushort)puVar8[(ulong)uVar7 + 1] - (uint)uVar3;
        memcpy((void *)((ulong)((uVar6 & 0xffff) * 2) + (long)local_50->individuo),
               (void *)((ulong)((uint)uVar3 * 2) + (long)pPVar9->individuo),
               (ulong)((uVar11 & 0xffff) * 2));
        uVar10 = (ulong)(uVar6 + uVar11);
        puVar8 = local_58;
        pPVar9 = local_48;
      }
      if ((ushort)uVar5 != i2->dimensione) {
        local_50->individuo[uVar10 & 0xffff] = i2->individuo[uVar13];
        uVar10 = (ulong)((int)uVar10 + 1);
      }
      uVar7 = uVar7 + 2;
    }
    else if (*(char *)((long)__s + (ulong)uVar3) == '\0') {
      local_50->individuo[uVar10 & 0xffff] = uVar3;
      uVar10 = (ulong)(uVar6 + 1);
    }
    uVar6 = (int)uVar13 + 1;
    uVar5 = (ulong)uVar6;
    uVar3 = i2->dimensione;
  } while ((ushort)uVar6 <= uVar3);
  operator_delete__(__s);
  operator_delete__(puVar8);
  return;
}

Assistant:

void ADE_DEP_DPFSP::subCrossover(Permutazione* i1, Permutazione* i2, Permutazione* ris) {

	bool* daEliminare = new bool[i1->dimensione];
	unsigned short* indiceTagli = new unsigned short[istanza.fabbriche * 2];

	for (unsigned short i = 0; i < i1->dimensione; i++) {
		daEliminare[i] = false; 
	}

	unsigned short f = 0;

	for (unsigned short i = 0; i <= i1->dimensione; i++) {

		if (i1->individuo[i] >= istanza.lavori || i == i1->dimensione) {

			if (f == 0) indiceTagli[0] = genRand.randIntU(0, i);
			else indiceTagli[f] = genRand.randIntU(indiceTagli[f - 1] + 1, i);

			indiceTagli[f + 1] = i;

			for (unsigned short k = indiceTagli[f]; k < indiceTagli[f + 1]; k++) {
				daEliminare[i1->individuo[k]] = true;
			}

			f += 2;
		}
	}

	unsigned short scostamento = 0;

	f = 0;

	for (unsigned short i = 0; i <= i2->dimensione; i++) {

		if (i2->individuo[i] >= istanza.lavori || i == i2->dimensione) {
			unsigned short lunghezzaSegmento = indiceTagli[f + 1] - indiceTagli[f];
			if (lunghezzaSegmento > 0) {
				memcpy(&(ris->individuo[scostamento]), &(i1->individuo[indiceTagli[f]]),
					lunghezzaSegmento*sizeof(unsigned short));
				scostamento += lunghezzaSegmento;
			}

			if(i != i2->dimensione) ris->individuo[scostamento++] = i2->individuo[i];

			f += 2;
		}
		else if (!daEliminare[i2->individuo[i]]) {
			ris->individuo[scostamento++] = i2->individuo[i];
		}
	}

	delete[] daEliminare;
	delete[] indiceTagli;
}